

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_string_tests.cpp
# Opt level: O1

void __thiscall
iu_UnitStringTest_x_iutest_x_WcsicmpNegativeGT_Test::Body
          (iu_UnitStringTest_x_iutest_x_WcsicmpNegativeGT_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 *puVar2;
  char *in_R9;
  AssertionResult iutest_ar;
  wchar_t negative_sample [5];
  int *in_stack_fffffffffffffdc8;
  AssertionResult local_230;
  AssertionHelper local_208;
  string local_1d8;
  wchar_t local_1b8 [8];
  undefined1 local_198 [32];
  bool local_178;
  ios_base local_118 [264];
  
  local_1b8[0] = L'a';
  local_1b8[1] = L'a';
  local_1b8[2] = L'a';
  local_1b8[3] = L'\xffffffff';
  local_1b8[4] = 0;
  local_1d8._M_dataplus._M_p._0_1_ = 0;
  iutest::detail::ExpressionLHS<bool>::ExpressionLHS
            ((ExpressionLHS<bool> *)&local_208,(bool *)&local_1d8);
  iutest::detail::ExpressionLHS<bool>::GetResult
            ((AssertionResult *)local_198,(ExpressionLHS<bool> *)&local_208,true);
  paVar1 = &local_230.m_message.field_2;
  local_230.m_message._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_230,CONCAT44(local_198._4_4_,local_198._0_4_),
             local_198._8_8_ + CONCAT44(local_198._4_4_,local_198._0_4_));
  local_230.m_result = local_178;
  if ((undefined1 *)CONCAT44(local_198._4_4_,local_198._0_4_) != local_198 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_198._4_4_,local_198._0_4_),local_198._16_8_ + 1);
  }
  if ((pointer)local_208.m_part_result.super_iuCodeMessage.m_message._M_string_length !=
      (pointer)((long)&local_208.m_part_result.super_iuCodeMessage.m_message.field_2 + 8)) {
    operator_delete((void *)local_208.m_part_result.super_iuCodeMessage.m_message._M_string_length,
                    local_208.m_part_result.super_iuCodeMessage.m_message.field_2._8_8_ + 1);
  }
  if (local_230.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_1d8,(internal *)&local_230,
               (AssertionResult *)
               "IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((!(sizeof(::std::wint_t) >= sizeof(int) && (sizeof(wchar_t) > 2 || ::iutest_type_traits::is_signed<wchar_t>::value))))"
               ,"false","true",in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,
               (char *)CONCAT71(local_1d8._M_dataplus._M_p._1_7_,local_1d8._M_dataplus._M_p._0_1_),
               (allocator<char> *)&stack0xfffffffffffffdcf);
    local_208.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_208.m_part_result.super_iuCodeMessage.m_line = 0x49;
    local_208.m_part_result.super_iuCodeMessage._44_4_ = 0xfffffffd;
    iutest::AssertionHelper::OnFixed(&local_208,(Fixed *)local_198,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                    (int)local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) !=
        &local_208.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._4_4_,
                               (int)local_208.m_part_result.super_iuCodeMessage.m_message.
                                    _M_dataplus._M_p),
                      local_208.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    puVar2 = (undefined1 *)
             CONCAT71(local_1d8._M_dataplus._M_p._1_7_,local_1d8._M_dataplus._M_p._0_1_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar2 != &local_1d8.field_2) {
LAB_00155bfc:
      operator_delete(puVar2,local_1d8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_230.m_message._M_dataplus._M_p,
                      CONCAT71(local_230.m_message.field_2._M_allocated_capacity._1_7_,
                               local_230.m_message.field_2._M_local_buf[0]) + 1);
    }
    local_198._0_4_ = 0;
    local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ =
         wcscasecmp(L"AAA",local_1b8);
    if ((int)local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p <
        (int)local_198._0_4_) {
      local_230.m_message._M_string_length = 0;
      local_230.m_message.field_2._M_local_buf[0] = '\0';
      local_230.m_result = true;
      local_230.m_message._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      iutest::internal::CmpHelperOpFailure<int,int>
                (&local_230,(internal *)0x171a14,
                 "::iutest::detail::iu_wcsicmp(L\"AAA\", negative_sample)",">",local_198,
                 (int *)&local_208,in_stack_fffffffffffffdc8);
    }
    if (local_230.m_result != false) goto LAB_00155c25;
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,local_230.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_1d8);
    local_208.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_208.m_part_result.super_iuCodeMessage.m_line = 0x4a;
    local_208.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_208,(Fixed *)local_198,false);
    puVar2 = (undefined1 *)
             CONCAT44(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                      (int)local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p);
    local_1d8.field_2._M_allocated_capacity =
         local_208.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar2 != &local_208.m_part_result.super_iuCodeMessage.m_message.field_2)
    goto LAB_00155bfc;
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
  std::ios_base::~ios_base(local_118);
LAB_00155c25:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_230.m_message._M_dataplus._M_p,
                    CONCAT71(local_230.m_message.field_2._M_allocated_capacity._1_7_,
                             local_230.m_message.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

IUTEST(UnitStringTest, WcsicmpNegativeGT)
{
    const wchar_t negative = static_cast<wchar_t>(-1);
    const wchar_t negative_sample[] = { L'a', L'a', L'a', negative, L'\0' };
    IUTEST_ASSUME(!(sizeof(::std::wint_t) >= sizeof(int) && (sizeof(wchar_t) > 2 || ::iutest_type_traits::is_signed<wchar_t>::value)));
    IUTEST_EXPECT_GT(0, ::iutest::detail::iu_wcsicmp(L"AAA", negative_sample));
}